

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

parameters __thiscall cpp_db::statement::get_parameters(statement *this)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  db_exception *this_00;
  weak_ptr<cpp_db::driver_interface> *in_RSI;
  element_type *local_40;
  string local_38;
  
  iVar3 = (*(in_RSI[1].super___weak_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_vptr_driver_interface[3])();
  if ((char)iVar3 != '\0') {
    parameters::parameters((parameters *)this);
    tools::lock_or_throw<cpp_db::driver_interface>
              ((tools *)&local_38,in_RSI,"Invalid database driver");
    (**(code **)(*(long *)local_38._M_dataplus._M_p + 0x20))
              (&local_40,local_38._M_dataplus._M_p,in_RSI + 1);
    peVar2 = local_40;
    local_40 = (element_type *)0x0;
    peVar1 = (this->driver_impl).
             super___weak_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->driver_impl).super___weak_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar2;
    if (peVar1 != (element_type *)0x0) {
      (*peVar1->_vptr_driver_interface[1])();
      if (local_40 != (element_type *)0x0) {
        (*local_40->_vptr_driver_interface[1])();
      }
    }
    local_40 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
    return (unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>
            )(unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>
              )this;
  }
  this_00 = (db_exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Statement not prepared!",(allocator<char> *)&local_40);
  db_exception::db_exception(this_00,&local_38);
  __cxa_throw(this_00,&db_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

parameters statement::get_parameters() const
{
	if (!is_prepared())
		throw db_exception("Statement not prepared!");

    parameters params;
    params.params_impl = tools::lock_or_throw(driver_impl, "Invalid database driver")->make_parameters(stmt_impl);
    return params;
}